

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

string * PrintColumn_abi_cxx11_
                   (string *__return_storage_ptr__,double x,size_t decDigits,size_t width)

{
  void *this;
  long local_1b0;
  stringstream ss;
  ostream local_1a0 [376];
  size_t local_28;
  size_t width_local;
  size_t decDigits_local;
  double x_local;
  
  local_28 = width;
  width_local = decDigits;
  decDigits_local = (size_t)x;
  x_local = (double)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  this = (void *)std::ostream::operator<<(local_1a0,std::fixed);
  std::ostream::operator<<(this,std::right);
  std::ios::fill((char)&local_1b0 + (char)*(undefined8 *)(local_1b0 + -0x18));
  std::ios_base::width((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),local_28);
  std::ios_base::precision
            ((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),width_local);
  std::ostream::operator<<(local_1a0,(double)decDigits_local);
  celero::console::SetConsoleColor(Default);
  std::operator<<(local_1a0," | ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintColumn(const double x, const size_t decDigits = PrintConstants::DoubleDecimals, const size_t width = PrintConstants::ColumnWidth)
{
	std::stringstream ss;
	ss << std::fixed << std::right;

	// fill space around displayed #
	ss.fill(' ');

	// set  width around displayed #
	ss.width(width);

	// set # places after decimal
	ss.precision(decDigits);
	ss << x;

	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);
	ss << " | ";
	return ss.str();
}